

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall icu_63::Calendar::recalculateStamp(Calendar *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  this->fNextStamp = 1;
  iVar3 = 1;
  for (iVar2 = 0; iVar2 != 0x17; iVar2 = iVar2 + 1) {
    iVar6 = 10000;
    uVar4 = 0xffffffff;
    for (lVar5 = 0; lVar5 != 0x17; lVar5 = lVar5 + 1) {
      iVar1 = this->fStamp[lVar5];
      if (iVar3 < iVar1 && iVar1 < iVar6) {
        uVar4 = (uint)lVar5;
        iVar6 = iVar1;
      }
    }
    if ((int)uVar4 < 0) break;
    this->fNextStamp = iVar3 + 1;
    this->fStamp[uVar4] = iVar3 + 1;
    iVar3 = this->fNextStamp;
  }
  this->fNextStamp = iVar3 + 1;
  return;
}

Assistant:

void
Calendar::recalculateStamp() {
    int32_t index;
    int32_t currentValue;
    int32_t j, i;

    fNextStamp = 1;

    for (j = 0; j < UCAL_FIELD_COUNT; j++) {
        currentValue = STAMP_MAX;
        index = -1;
        for (i = 0; i < UCAL_FIELD_COUNT; i++) {
            if (fStamp[i] > fNextStamp && fStamp[i] < currentValue) {
                currentValue = fStamp[i];
                index = i;
            }
        }

        if (index >= 0) {
            fStamp[index] = ++fNextStamp;
        } else {
            break;
        }
    }
    fNextStamp++;
}